

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int setChildPtrmaps(MemPage *pPage)

{
  u8 uVar1;
  u8 uVar2;
  ushort uVar3;
  Pgno parent;
  BtShared *pBt_00;
  u8 *puVar4;
  u32 uVar5;
  int local_4c;
  Pgno childPgno_1;
  Pgno childPgno;
  u8 *pCell;
  Pgno pgno;
  BtShared *pBt;
  uint local_20;
  int rc;
  int nCell;
  int i;
  MemPage *pPage_local;
  
  pBt_00 = pPage->pBt;
  parent = pPage->pgno;
  _nCell = pPage;
  if (pPage->isInit == '\0') {
    local_4c = btreeInitPage(pPage);
  }
  else {
    local_4c = 0;
  }
  pBt._4_4_ = local_4c;
  if (local_4c == 0) {
    local_20 = (uint)_nCell->nCell;
    for (rc = 0; rc < (int)local_20; rc = rc + 1) {
      puVar4 = _nCell->aData;
      uVar3 = _nCell->maskPage;
      uVar1 = _nCell->aCellIdx[rc << 1];
      uVar2 = _nCell->aCellIdx[(long)(rc << 1) + 1];
      ptrmapPutOvflPtr(_nCell,puVar4 + (int)(uint)(uVar3 & CONCAT11(uVar1,uVar2)),
                       (int *)((long)&pBt + 4));
      if (_nCell->leaf == '\0') {
        uVar5 = sqlite3Get4byte(puVar4 + (int)(uint)(uVar3 & CONCAT11(uVar1,uVar2)));
        ptrmapPut(pBt_00,uVar5,'\x05',parent,(int *)((long)&pBt + 4));
      }
    }
    if (_nCell->leaf == '\0') {
      uVar5 = sqlite3Get4byte(_nCell->aData + (int)(_nCell->hdrOffset + 8));
      ptrmapPut(pBt_00,uVar5,'\x05',parent,(int *)((long)&pBt + 4));
    }
    pPage_local._4_4_ = pBt._4_4_;
  }
  else {
    pPage_local._4_4_ = local_4c;
  }
  return pPage_local._4_4_;
}

Assistant:

static int setChildPtrmaps(MemPage *pPage){
  int i;                             /* Counter variable */
  int nCell;                         /* Number of cells in page pPage */
  int rc;                            /* Return code */
  BtShared *pBt = pPage->pBt;
  Pgno pgno = pPage->pgno;

  assert( sqlite3_mutex_held(pPage->pBt->mutex) );
  rc = pPage->isInit ? SQLITE_OK : btreeInitPage(pPage);
  if( rc!=SQLITE_OK ) return rc;
  nCell = pPage->nCell;

  for(i=0; i<nCell; i++){
    u8 *pCell = findCell(pPage, i);

    ptrmapPutOvflPtr(pPage, pCell, &rc);

    if( !pPage->leaf ){
      Pgno childPgno = get4byte(pCell);
      ptrmapPut(pBt, childPgno, PTRMAP_BTREE, pgno, &rc);
    }
  }

  if( !pPage->leaf ){
    Pgno childPgno = get4byte(&pPage->aData[pPage->hdrOffset+8]);
    ptrmapPut(pBt, childPgno, PTRMAP_BTREE, pgno, &rc);
  }

  return rc;
}